

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scheduler.hpp
# Opt level: O2

task_handle __thiscall
oqpi::scheduler<concurrent_queue>::add(scheduler<concurrent_queue> *this,task_handle *hTask)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  bool bVar3;
  task_priority prio;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  task_handle tVar5;
  
  _Var4._M_pi = in_RDX;
  if ((((task_sptr *)&in_RDX->_vptr__Sp_counted_base)->
      super___shared_ptr<oqpi::task_base,_(__gnu_cxx::_Lock_policy)2>)._M_ptr != (element_type *)0x0
     ) {
    bVar3 = task_handle::isGrabbed((task_handle *)in_RDX);
    _Var4._M_pi = extraout_RDX;
    if (!bVar3) {
      bVar3 = task_handle::isDone((task_handle *)in_RDX);
      _Var4._M_pi = extraout_RDX_00;
      if (!bVar3) {
        prio = resolveTaskPriority((scheduler<concurrent_queue> *)hTask,(task_handle *)in_RDX);
        concurrent_queue<oqpi::task_handle>::push
                  ((concurrent_queue<oqpi::task_handle> *)((long)hTask + (ulong)prio * 0x78 + 0x30),
                   (task_handle *)in_RDX);
        wakeUpWorkersWithPriority((scheduler<concurrent_queue> *)hTask,prio);
        _Var4._M_pi = extraout_RDX_01;
      }
    }
  }
  peVar1 = (((task_sptr *)&in_RDX->_vptr__Sp_counted_base)->
           super___shared_ptr<oqpi::task_base,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  p_Var2 = ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&in_RDX->_M_use_count)->_M_pi;
  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&in_RDX->_M_use_count)->_M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->workers_).
  super__Vector_base<std::unique_ptr<oqpi::worker_base,_std::default_delete<oqpi::worker_base>_>,_std::allocator<std::unique_ptr<oqpi::worker_base,_std::default_delete<oqpi::worker_base>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)peVar1;
  (this->workers_).
  super__Vector_base<std::unique_ptr<oqpi::worker_base,_std::default_delete<oqpi::worker_base>_>,_std::allocator<std::unique_ptr<oqpi::worker_base,_std::default_delete<oqpi::worker_base>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)p_Var2;
  (((task_sptr *)&in_RDX->_vptr__Sp_counted_base)->
  super___shared_ptr<oqpi::task_base,_(__gnu_cxx::_Lock_policy)2>)._M_ptr = (element_type *)0x0;
  tVar5.spTask_.super___shared_ptr<oqpi::task_base,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var4._M_pi;
  tVar5.spTask_.super___shared_ptr<oqpi::task_base,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (task_handle)tVar5.spTask_.super___shared_ptr<oqpi::task_base,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

task_handle add(task_handle hTask)
        {
            if (hTask.isValid() && !hTask.isGrabbed() && !hTask.isDone())
            {
                const auto priority = resolveTaskPriority(hTask);
                pendingTasks_[int(priority)].push(hTask);
                wakeUpWorkersWithPriority(priority);
            }
            return hTask;
        }